

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O0

void DUI_Panel(int width,int height)

{
  SDL_Rect bounds;
  int local_18;
  int local_14;
  
  local_18 = _duiCursor.x;
  local_14 = _duiCursor.y;
  DUI_setColorBackground();
  SDL_RenderFillRect(_duiRenderer,&local_18);
  DUI_setColorBorder();
  SDL_RenderDrawRect(_duiRenderer,&local_18);
  DUI_MoveCursorRelative(_duiStyle.PanelPadding,_duiStyle.PanelPadding);
  return;
}

Assistant:

void DUI_Panel(int width, int height)
{
    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    DUI_setColorBackground();
    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    DUI_MoveCursorRelative(_duiStyle.PanelPadding, _duiStyle.PanelPadding);
}